

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O3

void __thiscall
Assimp::AMFImporter::ParseHelper_Decode_Base64
          (AMFImporter *this,string *pInputBase64,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pOutputData)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator iVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  runtime_error *this_00;
  uint uVar8;
  long lVar9;
  uint8_t i;
  size_type sVar10;
  byte bVar11;
  long lVar13;
  byte *__args;
  uint8_t arr4 [4];
  uint8_t arr3 [3];
  string base64_chars;
  byte local_7f [4];
  byte local_7b [3];
  string *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  ulong uVar12;
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",
             "");
  uVar7 = pInputBase64->_M_string_length;
  local_78 = pInputBase64;
  if ((uVar7 & 3) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Base64-encoded data must have size multiply of four.","");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar2 = (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
    uVar7 = pInputBase64->_M_string_length;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(pOutputData,(uVar7 >> 2) * 3);
  sVar10 = local_78->_M_string_length;
  if (sVar10 != 0) {
    lVar9 = 0;
    uVar7 = 0;
    do {
      bVar4 = (local_78->_M_dataplus)._M_p[lVar9];
      uVar12 = uVar7;
      if ((char)bVar4 == 0x3d) break;
      iVar5 = isalnum((int)(char)bVar4);
      if (((bVar4 & 0xfb) == 0x2b) || (iVar5 != 0)) {
        bVar11 = (char)uVar7 + 1;
        uVar12 = (ulong)bVar11;
        local_7f[uVar7] = bVar4;
        if (bVar11 == 4) {
          lVar13 = 0;
          do {
            bVar4 = std::__cxx11::string::find
                              ((char)local_70,(ulong)(uint)(int)(char)local_7f[lVar13]);
            local_7f[lVar13] = bVar4;
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          local_7b[0] = local_7f[1] >> 4 & 3 | local_7f[0] << 2;
          local_7b[1] = local_7f[2] >> 2 & 0xf | local_7f[1] << 4;
          local_7b[2] = local_7f[2] * '@' + local_7f[3];
          lVar13 = 0;
          do {
            iVar3._M_current =
                 (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_realloc_insert<unsigned_char_const&>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)pOutputData,iVar3,
                         local_7b + lVar13);
            }
            else {
              *iVar3._M_current = local_7b[lVar13];
              ppuVar1 = &(pOutputData->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 3);
          uVar12 = 0;
        }
      }
      lVar9 = lVar9 + 1;
      sVar10 = sVar10 - 1;
      uVar7 = uVar12;
    } while (sVar10 != 0);
    bVar4 = (byte)uVar12;
    if (bVar4 != 0) {
      if (bVar4 < 4) {
        memset(local_7f + uVar12,0,(ulong)(byte)(4 - bVar4));
      }
      lVar9 = 0;
      do {
        bVar11 = std::__cxx11::string::find((char)local_70,(ulong)(uint)(int)(char)local_7f[lVar9]);
        local_7f[lVar9] = bVar11;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      local_7b[0] = local_7f[1] >> 4 & 3 | local_7f[0] << 2;
      local_7b[1] = local_7f[2] >> 2 & 0xf | local_7f[1] << 4;
      local_7b[2] = local_7f[2] * '@' + local_7f[3];
      if (bVar4 != 1) {
        __args = local_7b;
        uVar8 = 1;
        do {
          iVar3._M_current =
               (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pOutputData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_realloc_insert<unsigned_char_const&>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)pOutputData,iVar3,
                       __args);
          }
          else {
            *iVar3._M_current = *__args;
            ppuVar1 = &(pOutputData->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppuVar1 = *ppuVar1 + 1;
          }
          uVar6 = uVar8 & 0xff;
          __args = __args + 1;
          uVar8 = uVar6 + 1;
        } while ((int)uVar6 < (int)uVar12 + -1);
      }
    }
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void AMFImporter::ParseHelper_Decode_Base64(const std::string& pInputBase64, std::vector<uint8_t>& pOutputData) const
{
    // With help from
    // René Nyffenegger http://www.adp-gmbh.ch/cpp/common/base64.html
    const std::string base64_chars = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    uint8_t tidx = 0;
    uint8_t arr4[4], arr3[3];

	// check input data
	if(pInputBase64.size() % 4) throw DeadlyImportError("Base64-encoded data must have size multiply of four.");
	// prepare output place
	pOutputData.clear();
	pOutputData.reserve(pInputBase64.size() / 4 * 3);

	for(size_t in_len = pInputBase64.size(), in_idx = 0; (in_len > 0) && (pInputBase64[in_idx] != '='); in_len--)
	{
		if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx]))
		{
			arr4[tidx++] = pInputBase64[in_idx++];
			if(tidx == 4)
			{
				for(tidx = 0; tidx < 4; tidx++) arr4[tidx] = (uint8_t)base64_chars.find(arr4[tidx]);

				arr3[0] = (arr4[0] << 2) + ((arr4[1] & 0x30) >> 4);
				arr3[1] = ((arr4[1] & 0x0F) << 4) + ((arr4[2] & 0x3C) >> 2);
				arr3[2] = ((arr4[2] & 0x03) << 6) + arr4[3];
				for(tidx = 0; tidx < 3; tidx++) pOutputData.push_back(arr3[tidx]);

				tidx = 0;
			}// if(tidx == 4)
		}// if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx]))
		else
		{
			in_idx++;
		}// if(ParseHelper_Decode_Base64_IsBase64(pInputBase64[in_idx])) else
	}

	if(tidx)
	{
		for(uint8_t i = tidx; i < 4; i++) arr4[i] = 0;
		for(uint8_t i = 0; i < 4; i++) arr4[i] = (uint8_t)(base64_chars.find(arr4[i]));

		arr3[0] = (arr4[0] << 2) + ((arr4[1] & 0x30) >> 4);
		arr3[1] = ((arr4[1] & 0x0F) << 4) + ((arr4[2] & 0x3C) >> 2);
		arr3[2] = ((arr4[2] & 0x03) << 6) + arr4[3];
		for(uint8_t i = 0; i < (tidx - 1); i++) pOutputData.push_back(arr3[i]);
	}
}